

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatsoe.c
# Opt level: O0

int ecx_readIDNmap(ecx_contextt *context,uint16 slave,int *Osize,int *Isize)

{
  int iVar1;
  uint local_c0;
  ushort local_bc [2];
  ec_SoEattributet SoEattribute;
  ec_SoEmappingt SoEmapping;
  uint16 itemcount;
  uint16 entries;
  int psize;
  int wkc;
  int retVal;
  int *Isize_local;
  int *Osize_local;
  uint16 slave_local;
  ecx_contextt *context_local;
  
  psize = 0;
  *Isize = 0;
  *Osize = 0;
  SoEmapping.idn[0x3e] = 0x84;
  SoEmapping.idn[0x3f] = 0;
  iVar1 = ecx_SoEread(context,slave,'\0','@',0x18,(int *)(SoEmapping.idn + 0x3e),local_bc,700000);
  if ((0 < iVar1) && (3 < (int)SoEmapping.idn._124_4_)) {
    SoEmapping.idn[0x3d] = (uint16)((ulong)local_bc[0] / 2);
    if (((ulong)local_bc[0] / 2 != 0) && (SoEmapping.idn[0x3d] < 0x41)) {
      *Osize = 0x10;
      for (SoEmapping.idn[0x3c] = 0; SoEmapping.idn[0x3c] < SoEmapping.idn[0x3d];
          SoEmapping.idn[0x3c] = SoEmapping.idn[0x3c] + 1) {
        SoEmapping.idn[0x3e] = 4;
        SoEmapping.idn[0x3f] = 0;
        iVar1 = ecx_SoEread(context,slave,'\0','\x04',
                            SoEmapping.idn[(ulong)SoEmapping.idn[0x3c] - 4],
                            (int *)(SoEmapping.idn + 0x3e),&local_c0,700000);
        if ((0 < iVar1) && ((local_c0 >> 0x12 & 1) == 0)) {
          *Osize = (8 << ((byte)(local_c0 >> 0x10) & 3)) + *Osize;
        }
      }
    }
  }
  SoEmapping.idn[0x3e] = 0x84;
  SoEmapping.idn[0x3f] = 0;
  iVar1 = ecx_SoEread(context,slave,'\0','@',0x10,(int *)(SoEmapping.idn + 0x3e),local_bc,700000);
  if ((0 < iVar1) && (3 < (int)SoEmapping.idn._124_4_)) {
    SoEmapping.idn[0x3d] = (uint16)((ulong)local_bc[0] / 2);
    if (((ulong)local_bc[0] / 2 != 0) && (SoEmapping.idn[0x3d] < 0x41)) {
      *Isize = 0x10;
      for (SoEmapping.idn[0x3c] = 0; SoEmapping.idn[0x3c] < SoEmapping.idn[0x3d];
          SoEmapping.idn[0x3c] = SoEmapping.idn[0x3c] + 1) {
        SoEmapping.idn[0x3e] = 4;
        SoEmapping.idn[0x3f] = 0;
        iVar1 = ecx_SoEread(context,slave,'\0','\x04',
                            SoEmapping.idn[(ulong)SoEmapping.idn[0x3c] - 4],
                            (int *)(SoEmapping.idn + 0x3e),&local_c0,700000);
        if ((0 < iVar1) && ((local_c0 >> 0x12 & 1) == 0)) {
          *Isize = (8 << ((byte)(local_c0 >> 0x10) & 3)) + *Isize;
        }
      }
    }
  }
  if ((0 < *Isize) || (0 < *Osize)) {
    psize = 1;
  }
  return psize;
}

Assistant:

int ecx_readIDNmap(ecx_contextt *context, uint16 slave, int *Osize, int *Isize)
{
   int retVal = 0;
   int   wkc;
   int psize;
   uint16 entries, itemcount;
   ec_SoEmappingt     SoEmapping;
   ec_SoEattributet   SoEattribute;

   *Isize = 0;
   *Osize = 0;
   psize = sizeof(SoEmapping);
   /* read output mapping via SoE */
   wkc = ecx_SoEread(context, slave, 0, EC_SOE_VALUE_B, EC_IDN_MDTCONFIG, &psize, &SoEmapping, EC_TIMEOUTRXM);
   if ((wkc > 0) && (psize >= 4) && ((entries = etohs(SoEmapping.currentlength) / 2) > 0) && (entries <= EC_SOE_MAXMAPPING))
   {
      /* command word (uint16) is always mapped but not in list */
      *Osize = 16; 
      for (itemcount = 0 ; itemcount < entries ; itemcount++)
      {
         psize = sizeof(SoEattribute);
         /* read attribute of each IDN in mapping list */
         wkc = ecx_SoEread(context, slave, 0, EC_SOE_ATTRIBUTE_B, SoEmapping.idn[itemcount], &psize, &SoEattribute, EC_TIMEOUTRXM);
         if ((wkc > 0) && (!SoEattribute.list))
         {
            /* length : 0 = 8bit, 1 = 16bit .... */
            *Osize += (int)8 << SoEattribute.length;
         }   
      }   
   }   
   psize = sizeof(SoEmapping);
   /* read input mapping via SoE */
   wkc = ecx_SoEread(context, slave, 0, EC_SOE_VALUE_B, EC_IDN_ATCONFIG, &psize, &SoEmapping, EC_TIMEOUTRXM);
   if ((wkc > 0) && (psize >= 4) && ((entries = etohs(SoEmapping.currentlength) / 2) > 0) && (entries <= EC_SOE_MAXMAPPING))
   {
      /* status word (uint16) is always mapped but not in list */
      *Isize = 16; 
      for (itemcount = 0 ; itemcount < entries ; itemcount++)
      {
         psize = sizeof(SoEattribute);
         /* read attribute of each IDN in mapping list */
         wkc = ecx_SoEread(context, slave, 0, EC_SOE_ATTRIBUTE_B, SoEmapping.idn[itemcount], &psize, &SoEattribute, EC_TIMEOUTRXM);
         if ((wkc > 0) && (!SoEattribute.list))
         {
            /* length : 0 = 8bit, 1 = 16bit .... */
            *Isize += (int)8 << SoEattribute.length;
         }   
      }   
   }   

   /* found some I/O bits ? */
   if ((*Isize > 0) || (*Osize > 0))
   {
      retVal = 1;
   }
   return retVal;
}